

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::BlendCase::iterate(BlendCase *this)

{
  IVec3 *pIVar1;
  TextureFormat TVar2;
  ReferenceQuadRenderer *pRVar3;
  RenderContext *context;
  TestLog *log;
  byte bVar4;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int y;
  GLenum GVar8;
  char *pcVar9;
  RenderTarget *pRVar10;
  IterateResult IVar11;
  qpTestResult testResult;
  uint uVar12;
  pointer pBVar13;
  ConstPixelBufferAccess local_380;
  ConstPixelBufferAccess local_358;
  deUint32 local_32c;
  PixelFormat local_328;
  TextureLevel referenceImg;
  TextureLevel renderedImg;
  RGBA local_2c0 [4];
  Vector<unsigned_int,_4> local_2b0;
  UVec4 compareThreshold;
  FragmentOperationState referenceState;
  Vector<unsigned_int,_4> local_1f0;
  Vector<unsigned_int,_4> local_1e0;
  Vector<unsigned_int,_4> local_1d0;
  Random rnd;
  PixelBufferAccess nullAccess;
  
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar12 = ((uint)this->m_curParamSetNdx >> 0x10 ^ this->m_curParamSetNdx ^ 0x3d) * 9;
  uVar12 = (uVar12 >> 4 ^ uVar12) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar12 >> 0xf ^ dVar6 ^ uVar12);
  iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,0,this->m_renderWidth - this->m_viewportWidth);
  y = de::Random::getInt((Random *)&rnd.m_rnd,0,this->m_renderHeight - this->m_viewportHeight);
  nullAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
  if (this->m_useSrgbFbo != false) {
    nullAccess.super_ConstPixelBufferAccess.m_format.order = sRGBA;
  }
  nullAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  testResult = QP_TEST_RESULT_FAIL;
  tcu::TextureLevel::TextureLevel
            (&renderedImg,(TextureFormat *)&nullAccess,this->m_viewportWidth,this->m_viewportHeight,
             1);
  nullAccess.super_ConstPixelBufferAccess.m_format = renderedImg.m_format;
  tcu::TextureLevel::TextureLevel
            (&referenceImg,(TextureFormat *)&nullAccess,this->m_viewportWidth,this->m_viewportHeight
             ,1);
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pBVar13 = (this->m_paramSets).
            super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_curParamSetNdx;
  rr::FragmentOperationState::FragmentOperationState(&referenceState);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB equation = ");
  pcVar9 = glu::getBlendEquationName(pBVar13->equationRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB src func = ");
  pcVar9 = glu::getBlendFactorName(pBVar13->srcFuncRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"RGB dst func = ");
  pcVar9 = glu::getBlendFactorName(pBVar13->dstFuncRGB);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha equation = ");
  pcVar9 = glu::getBlendEquationName(pBVar13->equationAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha src func = ");
  pcVar9 = glu::getBlendFactorName(pBVar13->srcFuncAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Alpha dst func = ");
  pcVar9 = glu::getBlendFactorName(pBVar13->dstFuncAlpha);
  std::operator<<((ostream *)pIVar1,pcVar9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  pIVar1 = &nullAccess.super_ConstPixelBufferAccess.m_size;
  nullAccess.super_ConstPixelBufferAccess.m_format = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Blend color = (");
  std::ostream::operator<<(pIVar1,(pBVar13->blendColor).m_data[0]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar13->blendColor).m_data[1]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar13->blendColor).m_data[2]);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<(pIVar1,(pBVar13->blendColor).m_data[3]);
  std::operator<<((ostream *)pIVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&nullAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  glwBlendEquationSeparate(pBVar13->equationRGB,pBVar13->equationAlpha);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x117);
  glwBlendFuncSeparate
            (pBVar13->srcFuncRGB,pBVar13->dstFuncRGB,pBVar13->srcFuncAlpha,pBVar13->dstFuncAlpha);
  GVar8 = glwGetError();
  glu::checkError(GVar8,
                  "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x118);
  glwBlendColor((pBVar13->blendColor).m_data[0],(pBVar13->blendColor).m_data[1],
                (pBVar13->blendColor).m_data[2],(pBVar13->blendColor).m_data[3]);
  GVar8 = glwGetError();
  glu::checkError(GVar8,
                  "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                  ,0x119);
  referenceState.blendRGBState.equation = sglr::rr_util::mapGLBlendEquation(pBVar13->equationRGB);
  referenceState.blendRGBState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar13->srcFuncRGB);
  referenceState.blendRGBState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar13->dstFuncRGB);
  referenceState.blendAState.equation = sglr::rr_util::mapGLBlendEquation(pBVar13->equationAlpha);
  referenceState.blendAState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar13->srcFuncAlpha);
  referenceState.blendAState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar13->dstFuncAlpha);
  referenceState.blendColor.m_data._0_8_ = *(undefined8 *)(pBVar13->blendColor).m_data;
  referenceState.blendColor.m_data._8_8_ = *(undefined8 *)((pBVar13->blendColor).m_data + 2);
  glwDisable(0xbe2);
  glwViewport(iVar7,y,this->m_viewportWidth,this->m_viewportHeight);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&nullAccess.super_ConstPixelBufferAccess);
  referenceState.blendMode = BLENDMODE_NONE;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_358,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_380,(PixelBufferAccess *)&local_358);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_380,&nullAccess,&nullAccess,&this->m_firstQuadInt,
             &referenceState);
  referenceState.blendMode = BLENDMODE_STANDARD;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_358,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_380,(PixelBufferAccess *)&local_358);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_380,&nullAccess,&nullAccess,&this->m_secondQuadInt,
             &referenceState);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_380,&referenceImg);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_358,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_380,(EVP_PKEY_CTX *)&local_358);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_380,&renderedImg);
  glu::readPixels(context,iVar7,y,(PixelBufferAccess *)&local_380);
  bVar4 = this->m_useSrgbFbo;
  if ((bool)bVar4 == true) {
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_380,&renderedImg);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_358,&renderedImg);
    sRGBAToLinear((PixelBufferAccess *)&local_380,&local_358);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_380,&referenceImg);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_358,&referenceImg);
    sRGBAToLinear((PixelBufferAccess *)&local_380,&local_358);
    bVar4 = this->m_useSrgbFbo;
  }
  if ((bVar4 & 1) == 0) {
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_328.redBits = (pRVar10->m_pixelFormat).redBits;
    local_328.greenBits = (pRVar10->m_pixelFormat).greenBits;
    local_328.blueBits = (pRVar10->m_pixelFormat).blueBits;
    local_328.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
  }
  else {
    local_328.redBits = 8;
    local_328.greenBits = 8;
    local_328.blueBits = 8;
    local_328.alphaBits = 8;
  }
  local_32c = (deUint32)tcu::PixelFormat::getColorThreshold(&local_328);
  tcu::RGBA::toIVec(local_2c0);
  tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_2b0);
  tcu::Vector<unsigned_int,_4>::Vector(&local_1d0,5);
  tcu::operator*((tcu *)&local_358,&local_2b0,&local_1d0);
  tcu::Vector<unsigned_int,_4>::Vector(&local_1e0,2);
  tcu::operator/((tcu *)&local_380,(Vector<unsigned_int,_4> *)&local_358,&local_1e0);
  tcu::Vector<unsigned_int,_4>::Vector
            (&local_1f0,(uint)this->m_useSrgbFbo + (uint)this->m_useSrgbFbo * 2 + 2);
  tcu::operator+((tcu *)&compareThreshold,(Vector<unsigned_int,_4> *)&local_380,&local_1f0);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_380,&referenceImg);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_358,&renderedImg);
  bVar5 = tcu::intThresholdCompare
                    (log,"CompareResult","Image Comparison Result",&local_380,&local_358,
                     &compareThreshold,COMPARE_LOG_RESULT);
  if (bVar5) {
    iVar7 = this->m_curParamSetNdx + 1;
    this->m_curParamSetNdx = iVar7;
    if (iVar7 < (int)(((long)(this->m_paramSets).
                             super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_paramSets).
                            super__Vector_base<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      IVar11 = CONTINUE;
      goto LAB_0109f70d;
    }
    pcVar9 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    pcVar9 = "Image compare failed";
  }
  IVar11 = STOP;
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar9);
LAB_0109f70d:
  tcu::TextureLevel::~TextureLevel(&referenceImg);
  tcu::TextureLevel::~TextureLevel(&renderedImg);
  return IVar11;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_renderWidth - m_viewportWidth);
	int								viewportY		= rnd.getInt(0, m_renderHeight - m_viewportHeight);
	TextureLevel					renderedImg		(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_viewportWidth, m_viewportHeight);
	TextureLevel					referenceImg	(renderedImg.getFormat(), m_viewportWidth, m_viewportHeight);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportWidth, m_viewportHeight);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Copy to reference (expansion to RGBA happens here if necessary)
	copy(referenceImg, m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.
	// \note In sRGB cases, convert to linear space for comparison.

	if (m_useSrgbFbo)
	{
		sRGBAToLinear(renderedImg, renderedImg);
		sRGBAToLinear(referenceImg, referenceImg);
	}

	UVec4 compareThreshold = (m_useSrgbFbo ? tcu::PixelFormat(8, 8, 8, 8) : m_context.getRenderTarget().getPixelFormat()).getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(m_useSrgbFbo ? 5 : 2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result",
												referenceImg.getAccess(), renderedImg.getAccess(),
												compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}